

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_tec_fill(REF_ADJ ref_adj,char *filename)

{
  FILE *__stream;
  uint local_40;
  REF_INT local_3c;
  FILE *file;
  uint local_28;
  REF_INT nadj;
  REF_INT item;
  REF_INT node;
  char *filename_local;
  REF_ADJ ref_adj_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0xf7,
           "ref_adj_tec_fill","unable to open file");
    ref_adj_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine adj fill\"\n");
    fprintf(__stream,"variables = \"item\" \"node\"\n");
    file._4_4_ = 0;
    for (nadj = 0; nadj < ref_adj->nnode; nadj = nadj + 1) {
      if ((nadj < 0) || (ref_adj->nnode <= nadj)) {
        local_3c = -1;
      }
      else {
        local_3c = ref_adj->first[nadj];
      }
      for (local_28 = local_3c; local_28 != -1; local_28 = ref_adj->item[(int)local_28].next) {
        file._4_4_ = file._4_4_ + 1;
      }
    }
    fprintf(__stream,"zone t=\"fill\", i=%d, datapacking=%s\n",(ulong)file._4_4_,"point");
    for (nadj = 0; nadj < ref_adj->nnode; nadj = nadj + 1) {
      if ((nadj < 0) || (ref_adj->nnode <= nadj)) {
        local_40 = 0xffffffff;
      }
      else {
        local_40 = ref_adj->first[nadj];
      }
      for (local_28 = local_40; local_28 != 0xffffffff; local_28 = ref_adj->item[(int)local_28].next
          ) {
        fprintf(__stream," %d %d\n",(ulong)local_28,(ulong)(uint)nadj);
      }
    }
    fclose(__stream);
    ref_adj_local._4_4_ = 0;
  }
  return ref_adj_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_adj_tec_fill(REF_ADJ ref_adj, const char *filename) {
  REF_INT node, item, nadj;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine adj fill\"\n");
  fprintf(file, "variables = \"item\" \"node\"\n");

  nadj = 0;
  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    each_ref_adj_node_item(ref_adj, node, item) { nadj++; }
  }

  fprintf(file, "zone t=\"fill\", i=%d, datapacking=%s\n", nadj, "point");

  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    each_ref_adj_node_item(ref_adj, node, item) {
      fprintf(file, " %d %d\n", item, node);
    }
  }

  fclose(file);

  return REF_SUCCESS;
}